

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool __thiscall CS248::Shader::setVectorParameter(Shader *this,string *paramName,Vector3D *value)

{
  GLuint GVar1;
  PFNGLGETUNIFORMLOCATIONPROC p_Var2;
  GLint GVar3;
  GLchar *pGVar4;
  double *in_RDX;
  long in_RDI;
  int uniformLocation;
  bool success;
  
  p_Var2 = __glewGetUniformLocation;
  GVar1 = *(GLuint *)(in_RDI + 0x50);
  pGVar4 = (GLchar *)std::__cxx11::string::c_str();
  GVar3 = (*p_Var2)(GVar1,pGVar4);
  if (-1 < GVar3) {
    (*__glewUniform3f)(GVar3,(float)*in_RDX,(float)in_RDX[1],(float)in_RDX[2]);
  }
  return -1 < GVar3;
}

Assistant:

bool Shader::setVectorParameter(const std::string& paramName, const Vector3D& value) {

    bool success = true;
    int uniformLocation = glGetUniformLocation(programId_.id, paramName.c_str());

    if (uniformLocation >= 0)
        glUniform3f(uniformLocation, value.x, value.y, value.z);
    else 
        success = false;

    return success;
}